

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::UniversalTersePrinter<const_char_*>::Print(char *str,ostream *os)

{
  long in_FS_OFFSET;
  allocator<char> local_39;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (str == (char *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      std::operator<<(os,"NULL");
      return;
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,str,&local_39);
    PrintStringTo(&local_38,os);
    std::__cxx11::string::~string((string *)&local_38);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

static void Print(const char* str, ::std::ostream* os) {
    if (str == NULL) {
      *os << "NULL";
    } else {
      UniversalPrint(std::string(str), os);
    }
  }